

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O3

Mat * __thiscall Mat::resize(Mat *__return_storage_ptr__,Mat *this,int a,int b)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  int iVar3;
  pointer p_Var4;
  long lVar5;
  ulong uVar6;
  pointer p_Var7;
  long lVar8;
  int iVar9;
  int iVar10;
  vector<__int128,_std::allocator<__int128>_> temp;
  vector<__int128,_std::allocator<__int128>_> local_68;
  Mat *local_50;
  undefined8 local_48;
  undefined8 local_40;
  
  Mat(__return_storage_ptr__,a,b);
  local_68.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.super__Vector_impl_data.
  _M_finish = (__int128 *)0x0;
  local_68.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (__int128 *)0x0;
  iVar10 = this->r;
  iVar9 = 0;
  if (0 < iVar10) {
    iVar3 = this->c;
    local_50 = __return_storage_ptr__;
    do {
      if (0 < iVar3) {
        iVar10 = 0;
        do {
          lVar5 = (long)(this->r * iVar10 + iVar9);
          p_Var4 = (this->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_48 = (undefined8)p_Var4[lVar5];
          local_40 = *(undefined8 *)((long)p_Var4 + lVar5 * 0x10 + 8);
          if (local_68.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_68.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<__int128,_std::allocator<__int128>_>::_M_realloc_insert<__int128>
                      (&local_68,
                       (iterator)
                       local_68.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                       super__Vector_impl_data._M_finish,(__int128 *)&local_48);
            iVar3 = this->c;
          }
          else {
            *(undefined8 *)
             local_68.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
             super__Vector_impl_data._M_finish = local_48;
            *(undefined8 *)
             ((long)local_68.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                    super__Vector_impl_data._M_finish + 8) = local_40;
            local_68.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_68.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 < iVar3);
        iVar10 = this->r;
      }
      iVar9 = iVar9 + 1;
      __return_storage_ptr__ = local_50;
    } while (iVar9 < iVar10);
  }
  if (0 < a) {
    iVar10 = __return_storage_ptr__->r;
    p_Var4 = (__return_storage_ptr__->val).super__Vector_base<__int128,_std::allocator<__int128>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar6 = 0;
    iVar9 = 0;
    do {
      if (0 < b) {
        lVar5 = (long)iVar9;
        iVar9 = iVar9 + b;
        lVar8 = 0;
        p_Var7 = p_Var4;
        do {
          puVar1 = (undefined8 *)
                   ((long)local_68.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar8 + lVar5 * 0x10);
          uVar2 = puVar1[1];
          *(undefined8 *)p_Var7 = *puVar1;
          *(undefined8 *)((long)p_Var7 + 8) = uVar2;
          lVar8 = lVar8 + 0x10;
          p_Var7 = p_Var7 + iVar10;
        } while ((ulong)(uint)b << 4 != lVar8);
      }
      uVar6 = uVar6 + 1;
      p_Var4 = p_Var4 + 1;
    } while (uVar6 != (uint)a);
  }
  if (local_68.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::resize(int a, int b) {
    Mat ret(a, b);
    vector<ll128> temp;
    for (int i = 0; i < r; i++)
        for (int j = 0; j < c; j++)
            temp.push_back(get(i, j));
    int l = 0;
    for (int i = 0; i < a; i++)
        for (int j = 0; j < b; j++) {
            ret(i, j) = temp[l++];
        }
    return ret;
}